

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t parse_filter_data(archive_read *a,rar5 *rar,uint8_t *p,uint32_t *filter_data)

{
  wchar_t *pwVar1;
  byte bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  byte bVar6;
  wchar_t bytes;
  uint16_t byte;
  uint32_t *local_38;
  
  wVar3 = read_consume_bits(a,rar,p,L'\x02',&bytes);
  if (wVar3 == L'\0') {
    bytes = bytes + L'\x01';
    bVar6 = 0;
    uVar5 = 0;
    local_38 = filter_data;
    for (wVar3 = L'\0'; wVar3 < bytes; wVar3 = wVar3 + L'\x01') {
      wVar4 = read_bits_16(a,rar,p,&byte);
      if (wVar4 != L'\0') {
        return wVar4;
      }
      uVar5 = uVar5 + ((uint)byte._1_1_ << (bVar6 & 0x1f));
      bVar2 = (rar->bits).bit_addr;
      pwVar1 = &(rar->bits).in_addr;
      *pwVar1 = *pwVar1 + ((char)bVar2 + 8 >> 3);
      (rar->bits).bit_addr = bVar2 & 7;
      bVar6 = bVar6 + 8;
    }
    *local_38 = uVar5;
    wVar3 = L'\0';
  }
  return wVar3;
}

Assistant:

static int parse_filter_data(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, uint32_t* filter_data)
{
	int i, bytes, ret;
	uint32_t data = 0;

	if(ARCHIVE_OK != (ret = read_consume_bits(a, rar, p, 2, &bytes)))
		return ret;

	bytes++;

	for(i = 0; i < bytes; i++) {
		uint16_t byte;

		if(ARCHIVE_OK != (ret = read_bits_16(a, rar, p, &byte))) {
			return ret;
		}

		/* Cast to uint32_t will ensure the shift operation will not
		 * produce undefined result. */
		data += ((uint32_t) byte >> 8) << (i * 8);
		skip_bits(rar, 8);
	}

	*filter_data = data;
	return ARCHIVE_OK;
}